

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O1

void redraw_stuff(player *p)

{
  uint32_t *puVar1;
  uint uVar2;
  wchar_t wVar3;
  uint uVar4;
  _Bool _Var5;
  int16_t iVar6;
  long lVar7;
  
  uVar2 = p->upkeep->redraw;
  if ((uVar2 != 0) && (character_generated)) {
    _Var5 = map_is_visible();
    uVar4 = uVar2 & 0xf00000;
    if (_Var5) {
      uVar4 = uVar2;
    }
    iVar6 = player_resting_count(p);
    if ((((iVar6 * -0x3d70a3d7 + 0x51eb850U >> 2 | iVar6 * 0x40000000) < 0x28f5c29) &&
        (wVar3 = p->upkeep->running,
        (uint)((uint)(wVar3 * -0x3d70a3d7 + 0x51eb850U) >> 2 | wVar3 * 0x40000000) < 0x28f5c29)) ||
       ((uVar4 & 0x90000) != 0)) {
      lVar7 = 0;
      do {
        if ((redraw_events[lVar7].flag & uVar4) != 0) {
          event_signal(redraw_events[lVar7].event);
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x19);
      if ((uVar4 >> 0x10 & 1) != 0) {
        event_signal_point(EVENT_MAP,L'\xffffffff',L'\xffffffff');
      }
      puVar1 = &p->upkeep->redraw;
      *puVar1 = *puVar1 & ~uVar4;
      _Var5 = map_is_visible();
      if (_Var5) {
        event_signal(EVENT_END);
        return;
      }
    }
  }
  return;
}

Assistant:

void redraw_stuff(struct player *p)
{
	size_t i;
	uint32_t redraw = p->upkeep->redraw;

	/* Redraw stuff */
	if (!redraw) return;

	/* Character is not ready yet, no screen updates */
	if (!character_generated) return;

	/* Map is not shown, subwindow updates only */
	if (!map_is_visible()) 
		redraw &= PR_SUBWINDOW;

	/* Hack - rarely update while resting or running, makes it over quicker */
	if (((player_resting_count(p) % 100) || (p->upkeep->running % 100))
		&& !(redraw & (PR_MESSAGE | PR_MAP)))
		return;

	/* For each listed flag, send the appropriate signal to the UI */
	for (i = 0; i < N_ELEMENTS(redraw_events); i++) {
		const struct flag_event_trigger *hnd = &redraw_events[i];

		if (redraw & hnd->flag)
			event_signal(hnd->event);
	}

	/* Then the ones that require parameters to be supplied. */
	if (redraw & PR_MAP) {
		/* Mark the whole map to be redrawn */
		event_signal_point(EVENT_MAP, -1, -1);
	}

	p->upkeep->redraw &= ~redraw;

	/* Map is not shown, subwindow updates only */
	if (!map_is_visible()) return;

	/*
	 * Do any plotting, etc. delayed from earlier - this set of updates
	 * is over.
	 */
	event_signal(EVENT_END);
}